

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout.c
# Opt level: O3

void * stdout_new(t_symbol *s,int argc,t_atom *argv)

{
  t_pd *pp_Var1;
  t_symbol *ptVar2;
  t_symbol *ptVar3;
  
  pp_Var1 = pd_new(stdout_class);
  if (argc != 0) {
    do {
      ptVar2 = atom_getsymbol(argv);
      ptVar3 = gensym("-cr");
      if (ptVar3 == ptVar2) {
        *(undefined4 *)(pp_Var1 + 6) = 1;
      }
      else {
        ptVar3 = gensym("-b");
        if ((ptVar3 == ptVar2) || (ptVar3 = gensym("-binary"), ptVar3 == ptVar2)) {
          *(undefined4 *)(pp_Var1 + 6) = 2;
        }
        else {
          ptVar3 = gensym("-f");
          if ((ptVar3 == ptVar2) || (ptVar3 = gensym("-flush"), ptVar3 == ptVar2)) {
            *(undefined4 *)((long)pp_Var1 + 0x34) = 1;
          }
          else {
            ptVar3 = gensym("-nf");
            if ((ptVar3 == ptVar2) || (ptVar3 = gensym("-noflush"), ptVar3 == ptVar2)) {
              *(undefined4 *)((long)pp_Var1 + 0x34) = 0;
            }
            else {
              gensym("");
            }
          }
        }
      }
      argc = argc + -1;
      argv = argv + 1;
    } while (argc != 0);
  }
  ptVar2 = gensym("#pd_binary_stdio");
  if (ptVar2->s_thing != (_class **)0x0) {
    *(undefined4 *)(pp_Var1 + 6) = 3;
  }
  return pp_Var1;
}

Assistant:

static void *stdout_new(t_symbol*s, int argc, t_atom*argv)
{
    t_stdout *x = (t_stdout *)pd_new(stdout_class);
        /* for some reason in MS windows we have to flush standard out here -
        otherwise these outputs get out of order from the ones from pdsched.c
        over in ../pd~.  I'm guessing mingw (with its different C runtime
        support) will handle this correctly and so am only ifdeffing this on
        Microsoft C compiler.  It's an efficiency hit, possibly a serious
        one. */
#ifdef _MSC_VER
    x->x_flush = 1;
#endif

    while(argc--)
    {
        s = atom_getsymbol(argv++);
        if (gensym("-cr") == s)
        {
                /* No-semicolon mode */
            x->x_mode = MODE_CR;
        }
        else if ((gensym("-b") == s) || (gensym("-binary") == s))
        {
                /* Binary mode:
                   no extra characters (semicolons, CR,...) is appended
                 */
            x->x_mode = MODE_BIN;
        }
        else if ((gensym("-f") == s) || (gensym("-flush") == s))
        {
            x->x_flush = 1;
        }
        else if ((gensym("-nf") == s) || (gensym("-noflush") == s))
        {
            x->x_flush = 0;
        }
        else if (gensym("") != s)
        {
                /* unknown mode; ignore it */
        }
    }
    if (gensym("#pd_binary_stdio")->s_thing)
        x->x_mode = MODE_PDTILDE;
    return (x);
}